

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::tri_edge_inter_tail
          (tetgenmesh *this,double *A,double *B,double *C,double *P,double *Q,double s_p,double s_q)

{
  int iVar1;
  int iVar2;
  int types [2];
  int pos [4];
  
  iVar1 = tri_edge_tail(this,A,B,C,P,Q,(point)0x0,s_p,s_q,1,types,pos);
  if (iVar1 == 4) {
    iVar2 = types[0];
    if (types[0] != 3) {
      if (types[0] == 2) {
        iVar2 = (types[1] == 0) + 1;
      }
      else {
        iVar2 = 1;
      }
    }
  }
  else {
    iVar2 = 0;
    if (iVar1 == 2) {
      iVar2 = (types[0] == 2) + 1;
    }
  }
  return iVar2;
}

Assistant:

int tetgenmesh::tri_edge_inter_tail(REAL* A, REAL* B, REAL* C,  REAL* P, 
                                    REAL* Q, REAL s_p, REAL s_q)
{
  int types[2], pos[4];
  int ni;  // =0, 2, 4

  ni = tri_edge_tail(A, B, C, P, Q, NULL, s_p, s_q, 1, types, pos);

  if (ni > 0) {
    if (ni == 2) {
      // Get the intersection type.
      if (types[0] == (int) SHAREVERT) {
        return (int) SHAREVERT;
      } else {
        return (int) INTERSECT;
      }
    } else if (ni == 4) { 
      // There may be two intersections.
      if (types[0] == (int) SHAREVERT) {
        if (types[1] == (int) DISJOINT) {
          return (int) SHAREVERT;
        } else {
          return (int) INTERSECT;
        }
      } else {
        if (types[0] == (int) SHAREEDGE) {
          return (int) SHAREEDGE;
        } else {
          return (int) INTERSECT;
        }
      }
    }
  }

  return (int) DISJOINT;
}